

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.c
# Opt level: O1

int parg_reorder(int argc,char **argv,char *optstring,parg_option *longopts)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  char **ppcVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  parg_state ps;
  int local_7c;
  parg_state local_70;
  char **local_58;
  int local_4c;
  parg_state local_48;
  
  if (argv == (char **)0x0) {
    __assert_fail("argv != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/aras-p[P]sizer/src/parg.c",
                  0x142,"int parg_reorder(int, char **, const char *, const struct parg_option *)");
  }
  if (optstring == (char *)0x0) {
    __assert_fail("optstring != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/aras-p[P]sizer/src/parg.c",
                  0x143,"int parg_reorder(int, char **, const char *, const struct parg_option *)");
  }
  if (argc < 2) {
    return argc;
  }
  local_48.optarg = (char *)0x0;
  local_48.optind = 1;
  local_48.optopt = 0x3f;
  local_48.nextchar = (char *)0x0;
  do {
    iVar8 = local_48.optind;
    iVar3 = parg_getopt_long(&local_48,argc,argv,optstring,longopts,(int *)0x0);
    if ((iVar3 == 0x3a) || (iVar3 == 0x3f)) {
      if ((argc <= local_48.optind) || (argv[local_48.optind] == (char *)0x0)) {
        iVar8 = local_48.optind + -1;
        break;
      }
    }
  } while (iVar3 != -1);
  iVar3 = iVar8;
  if (1 < iVar8) {
    local_58 = argv + -1;
    local_4c = argc;
LAB_0010a85d:
    local_70.optarg = (char *)0x0;
    local_70.optind = 1;
    local_70.optopt = 0x3f;
    local_70.nextchar = (char *)0x0;
    do {
      iVar4 = parg_getopt_long(&local_70,iVar8,argv,optstring,longopts,(int *)0x0);
      if (local_70.nextchar == (char *)0x0) break;
    } while (*local_70.nextchar != '\0');
    bVar2 = false;
    iVar12 = 1;
LAB_0010a8b0:
    local_7c = iVar12;
    iVar3 = local_7c;
    iVar11 = local_7c;
    if (iVar4 != -1) {
      if (iVar4 != 1) {
        local_7c = local_70.optind;
        do {
          iVar4 = parg_getopt_long(&local_70,iVar8,argv,optstring,longopts,(int *)0x0);
          iVar12 = local_7c;
          if (local_70.nextchar == (char *)0x0) break;
        } while (*local_70.nextchar != '\0');
        goto LAB_0010a8b0;
      }
      do {
        iVar3 = local_70.optind;
        do {
          iVar4 = parg_getopt_long(&local_70,iVar8,argv,optstring,longopts,(int *)0x0);
          if (local_70.nextchar == (char *)0x0) break;
        } while (*local_70.nextchar != '\0');
        iVar11 = iVar3;
      } while (iVar4 == 1);
    }
LAB_0010a924:
    iVar12 = iVar3;
    if (iVar4 != -1) {
      if (iVar4 == 1) goto LAB_0010a95a;
      iVar3 = local_70.optind;
      do {
        iVar4 = parg_getopt_long(&local_70,iVar8,argv,optstring,longopts,(int *)0x0);
        if (local_70.nextchar == (char *)0x0) break;
      } while (*local_70.nextchar != '\0');
      goto LAB_0010a924;
    }
    goto LAB_0010a999;
  }
LAB_0010aa9c:
  if (iVar8 < argc) {
    if (1 < iVar8 - iVar3) {
      ppcVar7 = argv + iVar8;
      lVar5 = (long)iVar8 - (long)iVar3;
      lVar6 = (long)iVar3;
      do {
        ppcVar7 = ppcVar7 + -1;
        pcVar1 = argv[lVar6];
        argv[lVar6] = *ppcVar7;
        *ppcVar7 = pcVar1;
        lVar5 = lVar5 + -2;
        lVar6 = lVar6 + 1;
      } while (1 < lVar5);
    }
    iVar8 = iVar8 + 1;
    if (1 < iVar8 - iVar3) {
      ppcVar7 = argv + iVar8;
      lVar5 = (long)iVar8 - (long)iVar3;
      lVar6 = (long)iVar3;
      do {
        ppcVar7 = ppcVar7 + -1;
        pcVar1 = argv[lVar6];
        argv[lVar6] = *ppcVar7;
        *ppcVar7 = pcVar1;
        lVar5 = lVar5 + -2;
        lVar6 = lVar6 + 1;
      } while (1 < lVar5);
    }
    iVar3 = iVar3 + 1;
  }
  return iVar3;
LAB_0010a95a:
  do {
    iVar12 = local_70.optind;
    do {
      iVar4 = parg_getopt_long(&local_70,iVar8,argv,optstring,longopts,(int *)0x0);
      if (local_70.nextchar == (char *)0x0) break;
    } while (*local_70.nextchar != '\0');
  } while (iVar4 == 1);
LAB_0010a999:
  if (iVar11 < iVar3) {
    lVar5 = (long)local_7c;
    lVar6 = (long)iVar11;
    if (1 < iVar11 - local_7c) {
      lVar9 = lVar6 - lVar5;
      ppcVar7 = local_58 + lVar6;
      lVar10 = lVar5;
      do {
        pcVar1 = argv[lVar10];
        argv[lVar10] = *ppcVar7;
        *ppcVar7 = pcVar1;
        lVar9 = lVar9 + -2;
        ppcVar7 = ppcVar7 + -1;
        lVar10 = lVar10 + 1;
      } while (1 < lVar9);
    }
    lVar10 = (long)iVar3;
    if (1 < iVar3 - iVar11) {
      lVar9 = lVar10 - lVar6;
      ppcVar7 = local_58 + lVar10;
      do {
        pcVar1 = argv[lVar6];
        argv[lVar6] = *ppcVar7;
        *ppcVar7 = pcVar1;
        lVar9 = lVar9 + -2;
        ppcVar7 = ppcVar7 + -1;
        lVar6 = lVar6 + 1;
      } while (1 < lVar9);
    }
    bVar2 = true;
    if (1 < iVar3 - local_7c) {
      ppcVar7 = local_58 + lVar10;
      lVar10 = lVar10 - lVar5;
      do {
        pcVar1 = argv[lVar5];
        argv[lVar5] = *ppcVar7;
        *ppcVar7 = pcVar1;
        lVar10 = lVar10 + -2;
        ppcVar7 = ppcVar7 + -1;
        lVar5 = lVar5 + 1;
      } while (1 < lVar10);
    }
  }
  if (iVar4 == -1) goto code_r0x0010aa7d;
  goto LAB_0010a8b0;
code_r0x0010aa7d:
  if (!bVar2) goto code_r0x0010aa88;
  goto LAB_0010a85d;
code_r0x0010aa88:
  iVar3 = (local_7c - iVar11) + iVar3;
  argc = local_4c;
  goto LAB_0010aa9c;
}

Assistant:

int
parg_reorder(int argc, char *argv[],
             const char *optstring,
             const struct parg_option *longopts)
{
	struct parg_state ps;
	int lastind;
	int optend;
	int c;

	assert(argv != NULL);
	assert(optstring != NULL);

	if (argc < 2) {
		return argc;
	}

	parg_init(&ps);

	/* Find end of normal arguments */
	do {
		lastind = ps.optind;

		c = parg_getopt_long(&ps, argc, argv, optstring, longopts, NULL);

		/* Check for trailing option with error */
		if ((c == '?' || c == ':') && is_argv_end(&ps, argc, argv)) {
			lastind = ps.optind - 1;
			break;
		}
	} while (c != -1);

	optend = parg_reorder_simple(lastind, argv, optstring, longopts);

	/* Rotate `--` or trailing option with error into position */
	if (lastind < argc) {
		reverse(argv, optend, lastind);
		reverse(argv, optend, lastind + 1);
		++optend;
	}

	return optend;
}